

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

Ptr __thiscall hwnet::ThreadPool::TaskQueue::Get(TaskQueue *this)

{
  bool bVar1;
  reference pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  byte *in_RSI;
  Ptr PVar3;
  Ptr *task;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  TaskQueue *this_local;
  Ptr *task_1;
  
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)(in_RSI + 8));
  do {
    if ((*in_RSI & 1) != 0) {
      bVar1 = std::
              deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
              empty((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                     *)(in_RSI + 0x70));
      if (bVar1) {
        std::shared_ptr<hwnet::Task>::shared_ptr((shared_ptr<hwnet::Task> *)this,(nullptr_t)0x0);
      }
      else {
        pvVar2 = std::
                 deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                 ::front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                          *)(in_RSI + 0x70));
        std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
        pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                   *)(in_RSI + 0x70));
        std::shared_ptr<hwnet::Task>::shared_ptr((shared_ptr<hwnet::Task> *)this,pvVar2);
      }
LAB_00153d40:
      std::lock_guard<std::mutex>::~lock_guard(&local_20);
      PVar3.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      PVar3.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar3.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>;
    }
    bVar1 = std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
            ::empty((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                     *)(in_RSI + 0x70));
    if (!bVar1) {
      pvVar2 = std::
               deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
               front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                      *)(in_RSI + 0x70));
      std::shared_ptr<hwnet::Task>::shared_ptr((shared_ptr<hwnet::Task> *)this,pvVar2);
      std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::
      pop_front((deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>
                 *)(in_RSI + 0x70));
      goto LAB_00153d40;
    }
    *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) + 1;
    std::_V2::condition_variable_any::wait<std::mutex>
              ((condition_variable_any *)(in_RSI + 0x30),(mutex *)(in_RSI + 8));
    *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) + -1;
  } while( true );
}

Assistant:

Task::Ptr ThreadPool::TaskQueue::Get() {
	std::lock_guard<std::mutex> guard(this->mtx);
	for( ; ;) {
		if(this->closed) {
			if(this->tasks.empty()) {
				return nullptr;
			} else {
				Task::Ptr &task = this->tasks.front();
				this->tasks.pop_front();
				return task;
			}
		} else {

			if(this->tasks.empty()) {
				++this->watting;//增加等待数量
				this->cv.wait(this->mtx);
				--this->watting;//减少正在等待的线程数量	
			} else {
				Task::Ptr task = this->tasks.front();
				this->tasks.pop_front();
				return task;
			}	
		}
	}
}